

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O2

void project_monster_handler_TURN_LIVING(project_monster_handler_context_t *context)

{
  _Bool _Var1;
  
  if (context->seen == true) {
    flag_on_dbg(context->lore->flags,0xb,0x3f,"context->lore->flags","RF_NONLIVING");
    flag_on_dbg(context->lore->flags,0xb,0x3e,"context->lore->flags","RF_UNDEAD");
  }
  _Var1 = monster_is_living(context->mon);
  if (_Var1) {
    context->mon_timed[3] = (context->dam + context->r) / (context->r + L'\x01');
    if (context->seen == true) {
      context->obvious = true;
    }
  }
  else {
    context->skipped = true;
  }
  context->dam = L'\0';
  return;
}

Assistant:

static void project_monster_handler_TURN_LIVING(project_monster_handler_context_t *context)
{
	if (context->seen) {
		rf_on(context->lore->flags, RF_NONLIVING);
		rf_on(context->lore->flags, RF_UNDEAD);
	}

	if (monster_is_living(context->mon)) {
		context->mon_timed[MON_TMD_FEAR] =
			adjust_radius(context, context->dam);
		if (context->seen) context->obvious = true;
	} else {
		context->skipped = true;
	}

	context->dam = 0;
}